

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_rescale_enc.c
# Opt level: O0

int AdjustAndCheckRectangle(WebPPicture *pic,int *left,int *top,int width,int height)

{
  int in_ECX;
  int *in_RDX;
  int *in_RSI;
  WebPPicture *in_RDI;
  int in_R8D;
  int local_4;
  
  SnapTopLeftPosition(in_RDI,in_RSI,in_RDX);
  if ((*in_RSI < 0) || (*in_RDX < 0)) {
    local_4 = 0;
  }
  else if ((in_ECX < 1) || (in_R8D < 1)) {
    local_4 = 0;
  }
  else if (in_RDI->width < *in_RSI + in_ECX) {
    local_4 = 0;
  }
  else if (in_RDI->height < *in_RDX + in_R8D) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int AdjustAndCheckRectangle(const WebPPicture* const pic,
                                   int* const left, int* const top,
                                   int width, int height) {
  SnapTopLeftPosition(pic, left, top);
  if ((*left) < 0 || (*top) < 0) return 0;
  if (width <= 0 || height <= 0) return 0;
  if ((*left) + width > pic->width) return 0;
  if ((*top) + height > pic->height) return 0;
  return 1;
}